

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall pbrt::SpectrumHandle::ToString_abi_cxx11_(SpectrumHandle *this)

{
  void *pvVar1;
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  anon_class_1_0_00000001 tostr;
  allocator<char> local_11;
  allocator<char> *__a;
  string *__s;
  
  __a = in_RSI;
  __s = in_RDI;
  pvVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           ::ptr((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                  *)in_RSI);
  if (pvVar1 == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
    ::DispatchCPU<pbrt::SpectrumHandle::ToString[abi:cxx11]()const::__0>
              ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string SpectrumHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto tostr = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(tostr);
}